

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<12,_2,_5,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  float afStack_3c [9];
  int aiStack_18 [6];
  
  fVar1 = evalCtx->in[0].m_data[0];
  fVar2 = evalCtx->in[0].m_data[1];
  fVar3 = evalCtx->in[1].m_data[0];
  fVar4 = evalCtx->in[1].m_data[1];
  afStack_3c[2] = fVar1 - fVar1;
  afStack_3c[3] = fVar3 - fVar3;
  afStack_3c[4] = (fVar2 - fVar2) + (fVar4 - fVar4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = afStack_3c[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) - b(row, col);
	return res;
}